

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O2

void __thiscall
brotli::BlockEncoder::BuildAndStoreEntropyCodes<520>
          (BlockEncoder *this,
          vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *histograms,
          size_t *storage_ix,uint8_t *storage)

{
  pointer pHVar1;
  long lVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->depths_,
             (((long)(histograms->
                     super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(histograms->
                    super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x830) * this->alphabet_size_);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->bits_,
             (((long)(histograms->
                     super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(histograms->
                    super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x830) * this->alphabet_size_);
  lVar3 = 0;
  for (uVar4 = 0;
      pHVar1 = (histograms->
               super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>)
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(histograms->
                             super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1) / 0x830);
      uVar4 = uVar4 + 1) {
    lVar2 = this->alphabet_size_ * uVar4;
    BuildAndStoreHuffmanTree
              ((uint32_t *)((long)pHVar1->data_ + lVar3),this->alphabet_size_,
               (this->depths_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar2,
               (this->bits_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar2,storage_ix,storage);
    lVar3 = lVar3 + 0x830;
  }
  return;
}

Assistant:

void BuildAndStoreEntropyCodes(
      const std::vector<Histogram<kSize> >& histograms,
      size_t* storage_ix, uint8_t* storage) {
    depths_.resize(histograms.size() * alphabet_size_);
    bits_.resize(histograms.size() * alphabet_size_);
    for (size_t i = 0; i < histograms.size(); ++i) {
      size_t ix = i * alphabet_size_;
      BuildAndStoreHuffmanTree(&histograms[i].data_[0], alphabet_size_,
                               &depths_[ix], &bits_[ix],
                               storage_ix, storage);
    }
  }